

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_append.c
# Opt level: O2

int mpt_message_append(mpt_array *arr,mpt_message *msg)

{
  void *pvVar1;
  size_t sVar2;
  size_t *psVar3;
  size_t sVar4;
  
  if (arr->_buf == (mpt_buffer *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = arr->_buf->_used;
  }
  if ((msg->used == 0) ||
     (pvVar1 = mpt_array_append(arr,msg->used,msg->base), pvVar1 != (void *)0x0)) {
    sVar4 = msg->clen;
    psVar3 = &msg->cont->iov_len;
    while( true ) {
      sVar4 = sVar4 - 1;
      if (sVar4 == 0) {
        return 0;
      }
      if ((*psVar3 != 0) &&
         (pvVar1 = mpt_array_append(arr,*psVar3,((iovec *)(psVar3 + -1))->iov_base),
         pvVar1 == (void *)0x0)) break;
      psVar3 = psVar3 + 2;
    }
  }
  if (arr->_buf == (mpt_buffer *)0x0) {
    return -0x11;
  }
  arr->_buf->_used = sVar2;
  return -0x11;
}

Assistant:

extern int mpt_message_append(MPT_STRUCT(array) *arr, const MPT_STRUCT(message) *msg)
{
	MPT_STRUCT(buffer) *buf;
	struct iovec *cont;
	size_t used ,olen, clen;
	
	olen = (buf = arr->_buf) ? buf->_used : 0;
	
	/* process first message part */
	if ((used = msg->used)
	    && !mpt_array_append(arr, used, msg->base)) {
		/* reset array state */
		if ((buf = arr->_buf)) {
			buf->_used = olen;
		}
		return MPT_ERROR(MissingBuffer);
	}
	/* trailing message parts */
	cont = msg->cont;
	clen = msg->clen;
	while (--clen) {
		const uint8_t *base;
		base = cont->iov_base;
		used = cont->iov_len;
		++cont;
		/* skip empty segments */
		if (!used || mpt_array_append(arr, used, base)) {
			continue;
		}
		/* reset array state */
		if ((buf = arr->_buf)) {
			buf->_used = olen;
		}
		return MPT_ERROR(MissingBuffer);
	}
	return 0;
}